

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O1

void __thiscall cmDebugServerJson::SendStatus(cmDebugServerJson *this,cmConnection *connection)

{
  string status;
  string local_30;
  
  StatusString_abi_cxx11_(&local_30,this);
  if (local_30._M_string_length != 0) {
    (**connection->_vptr_cmConnection)(connection,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDebugServerJson::SendStatus(cmConnection* connection)
{
  auto status = StatusString();
  if (status.size()) {
    connection->WriteData(status);
  }
}